

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_sse4.c
# Opt level: O0

_Bool aom_compute_mean_stddev_sse4_1
                (uchar *frame,int stride,int x,int y,double *mean,double *one_over_stddev)

{
  undefined1 auVar1 [16];
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double __x;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double variance;
  int sumsq;
  int sum;
  __m128i tmp;
  __m128i partial_sumsq;
  __m128i partial_sum;
  __m128i ones;
  __m128i v_r;
  __m128i v_l;
  __m128i v;
  int i;
  __m128i sumsq_vec_r;
  __m128i sumsq_vec_l;
  __m128i sum_vec;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 (*local_1a8) [16];
  undefined8 local_158;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  iStack_1e4 = 0;
  iStack_1e0 = 0;
  iStack_1dc = 0;
  local_1f8 = 0;
  iStack_1f4 = 0;
  iStack_1f0 = 0;
  iStack_1ec = 0;
  local_1a8 = (undefined1 (*) [16])(in_RDI + ((in_ECX + -7) * in_ESI + in_EDX + -7));
  for (local_1fc = 0; local_1fc < 0x10; local_1fc = local_1fc + 1) {
    auVar3 = pmovzxbw(*local_1a8,*(undefined8 *)*local_1a8);
    local_158 = SUB168(*local_1a8,8);
    auVar4 = pmovzxbw(*local_1a8 >> 0x40,local_158);
    local_108 = auVar3._0_2_;
    sStack_106 = auVar3._2_2_;
    sStack_104 = auVar3._4_2_;
    sStack_102 = auVar3._6_2_;
    sStack_100 = auVar3._8_2_;
    sStack_fe = auVar3._10_2_;
    sStack_fc = auVar3._12_2_;
    sStack_fa = auVar3._14_2_;
    local_118 = auVar4._0_2_;
    sStack_116 = auVar4._2_2_;
    sStack_114 = auVar4._4_2_;
    sStack_112 = auVar4._6_2_;
    sStack_110 = auVar4._8_2_;
    sStack_10e = auVar4._10_2_;
    sStack_10c = auVar4._12_2_;
    sStack_10a = auVar4._14_2_;
    local_128 = (short)local_1d8;
    sStack_126 = (short)((ulong)local_1d8 >> 0x10);
    sStack_124 = (short)((ulong)local_1d8 >> 0x20);
    sStack_122 = (short)((ulong)local_1d8 >> 0x30);
    sStack_120 = (short)uStack_1d0;
    sStack_11e = (short)((ulong)uStack_1d0 >> 0x10);
    sStack_11c = (short)((ulong)uStack_1d0 >> 0x20);
    sStack_11a = (short)((ulong)uStack_1d0 >> 0x30);
    local_1d8 = CONCAT26(sStack_122 + sStack_102 + sStack_112,
                         CONCAT24(sStack_124 + sStack_104 + sStack_114,
                                  CONCAT22(sStack_126 + sStack_106 + sStack_116,
                                           local_128 + local_108 + local_118)));
    uStack_1d0 = CONCAT26(sStack_11a + sStack_fa + sStack_10a,
                          CONCAT24(sStack_11c + sStack_fc + sStack_10c,
                                   CONCAT22(sStack_11e + sStack_fe + sStack_10e,
                                            sStack_120 + sStack_100 + sStack_110)));
    auVar3 = pmaddwd(auVar3,auVar3);
    local_b8 = auVar3._0_4_;
    iStack_b4 = auVar3._4_4_;
    iStack_b0 = auVar3._8_4_;
    iStack_ac = auVar3._12_4_;
    local_1e8 = local_1e8 + local_b8;
    iStack_1e4 = iStack_1e4 + iStack_b4;
    iStack_1e0 = iStack_1e0 + iStack_b0;
    iStack_1dc = iStack_1dc + iStack_ac;
    auVar3 = pmaddwd(auVar4,auVar4);
    local_d8 = auVar3._0_4_;
    iStack_d4 = auVar3._4_4_;
    iStack_d0 = auVar3._8_4_;
    iStack_cc = auVar3._12_4_;
    local_1f8 = local_1f8 + local_d8;
    iStack_1f4 = iStack_1f4 + iStack_d4;
    iStack_1f0 = iStack_1f0 + iStack_d0;
    iStack_1ec = iStack_1ec + iStack_cc;
    local_1a8 = (undefined1 (*) [16])(*local_1a8 + in_ESI);
  }
  auVar4._8_8_ = uStack_1d0;
  auVar4._0_8_ = local_1d8;
  auVar3._8_2_ = 1;
  auVar3._10_2_ = 1;
  auVar3._12_2_ = 1;
  auVar3._14_2_ = 1;
  auVar3._0_2_ = 1;
  auVar3._2_2_ = 1;
  auVar3._4_2_ = 1;
  auVar3._6_2_ = 1;
  auVar3 = pmaddwd(auVar4,auVar3);
  auVar1._4_4_ = iStack_1e4 + iStack_1f4;
  auVar1._0_4_ = local_1e8 + local_1f8;
  auVar1._12_4_ = iStack_1dc + iStack_1ec;
  auVar1._8_4_ = iStack_1e0 + iStack_1f0;
  auVar3 = phaddd(auVar3,auVar1);
  local_278 = auVar3._0_4_;
  iStack_274 = auVar3._4_4_;
  iStack_270 = auVar3._8_4_;
  iStack_26c = auVar3._12_4_;
  *in_R8 = (double)(local_278 + iStack_274) / 16.0;
  __x = -*in_R8 * *in_R8 + (double)(iStack_270 + iStack_26c);
  if (256.0 <= __x) {
    dVar2 = sqrt(__x);
    *in_R9 = 1.0 / dVar2;
  }
  else {
    *in_R9 = 0.0;
  }
  return 256.0 <= __x;
}

Assistant:

bool aom_compute_mean_stddev_sse4_1(const unsigned char *frame, int stride,
                                    int x, int y, double *mean,
                                    double *one_over_stddev) {
  // 8 16-bit partial sums of pixels
  // Each lane sums at most 2*MATCH_SZ pixels, which can have values up to 255,
  // and is therefore at most 2*MATCH_SZ*255, which is > 2^8 but < 2^16.
  // Thus this value is safe to store in 16 bits.
  __m128i sum_vec = _mm_setzero_si128();

  // 8 32-bit partial sums of squares
  __m128i sumsq_vec_l = _mm_setzero_si128();
  __m128i sumsq_vec_r = _mm_setzero_si128();

  frame += (y - MATCH_SZ_BY2) * stride + (x - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m128i v = _mm_loadu_si128((__m128i *)frame);
    const __m128i v_l = _mm_cvtepu8_epi16(v);
    const __m128i v_r = _mm_cvtepu8_epi16(_mm_srli_si128(v, 8));

    sum_vec = _mm_add_epi16(sum_vec, _mm_add_epi16(v_l, v_r));
    sumsq_vec_l = _mm_add_epi32(sumsq_vec_l, _mm_madd_epi16(v_l, v_l));
    sumsq_vec_r = _mm_add_epi32(sumsq_vec_r, _mm_madd_epi16(v_r, v_r));

    frame += stride;
  }

  // Reduce sum_vec and sumsq_vec into single values
  // Start by reducing each vector to 4x32-bit values, hadd() to perform four
  // additions, then perform the last two additions in scalar code.
  const __m128i ones = _mm_load_si128((__m128i *)ones_array);
  const __m128i partial_sum = _mm_madd_epi16(sum_vec, ones);
  const __m128i partial_sumsq = _mm_add_epi32(sumsq_vec_l, sumsq_vec_r);
  const __m128i tmp = _mm_hadd_epi32(partial_sum, partial_sumsq);
  const int sum = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1);
  const int sumsq = _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  *mean = (double)sum / MATCH_SZ;
  const double variance = sumsq - (*mean) * (*mean);
  if (variance < MIN_FEATURE_VARIANCE) {
    *one_over_stddev = 0.0;
    return false;
  }
  *one_over_stddev = 1.0 / sqrt(variance);
  return true;
}